

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O0

float __thiscall
lunasvg::LengthContext::viewportDimension(LengthContext *this,LengthDirection direction)

{
  Size SVar1;
  double dVar2;
  float local_24;
  float fStack_20;
  Size viewportSize;
  LengthDirection direction_local;
  LengthContext *this_local;
  
  SVar1 = SVGElement::currentViewportSize(this->m_element);
  local_24 = SVar1.w;
  if (direction == Horizontal) {
    this_local._4_4_ = local_24;
  }
  else {
    fStack_20 = SVar1.h;
    if (direction == Vertical) {
      this_local._4_4_ = fStack_20;
    }
    else {
      dVar2 = std::sqrt((double)(ulong)(uint)(local_24 * local_24 + fStack_20 * fStack_20));
      this_local._4_4_ = SUB84(dVar2,0) / 1.4142135;
    }
  }
  return this_local._4_4_;
}

Assistant:

float LengthContext::viewportDimension(LengthDirection direction) const
{
    auto viewportSize = m_element->currentViewportSize();
    switch(direction) {
    case LengthDirection::Horizontal:
        return viewportSize.w;
    case LengthDirection::Vertical:
        return viewportSize.h;
    default:
        return std::sqrt(viewportSize.w * viewportSize.w + viewportSize.h * viewportSize.h) / PLUTOVG_SQRT2;
    }
}